

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasFloat32InputsOrOutputsForNonmaxSuppression(Model *model)

{
  bool bVar1;
  TypeCase TVar2;
  ArrayFeatureType_ArrayDataType AVar3;
  ModelDescription *pMVar4;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar5;
  reference pFVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  FeatureDescription *output;
  iterator __end1_1;
  iterator __begin1_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> outputs;
  FeatureDescription *input;
  iterator __end1;
  RepeatedPtrIterator<CoreML::Specification::FeatureDescription> local_40;
  iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> inputs;
  Model *model_local;
  
  inputs.super_RepeatedPtrFieldBase.rep_ = (Rep *)model;
  bVar1 = hasNonmaxSuppression(model);
  if (bVar1) {
    pMVar4 = Specification::Model::description((Model *)inputs.super_RepeatedPtrFieldBase.rep_);
    pRVar5 = Specification::ModelDescription::input(pMVar4);
    google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::RepeatedPtrField
              ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)&__range1,pRVar5);
    __begin1.it_ = (void **)&__range1;
    local_40.it_ = (void **)google::protobuf::
                            RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                                      ((RepeatedPtrField<CoreML::Specification::FeatureDescription>
                                        *)&__range1);
    input = (FeatureDescription *)
            google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                      ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)__begin1.it_);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<CoreML::Specification::FeatureDescription>::operator!=
                             (&local_40,(iterator *)&input), bVar1) {
      pFVar6 = google::protobuf::internal::
               RepeatedPtrIterator<CoreML::Specification::FeatureDescription>::operator*(&local_40);
      pFVar7 = Specification::FeatureDescription::type(pFVar6);
      TVar2 = Specification::FeatureType::Type_case(pFVar7);
      if (TVar2 == kMultiArrayType) {
        pFVar7 = Specification::FeatureDescription::type(pFVar6);
        pAVar8 = Specification::FeatureType::multiarraytype(pFVar7);
        AVar3 = Specification::ArrayFeatureType::datatype(pAVar8);
        if (AVar3 == ArrayFeatureType_ArrayDataType_FLOAT32) {
          model_local._7_1_ = true;
          outputs.super_RepeatedPtrFieldBase.rep_._4_4_ = 1;
          goto LAB_003563f9;
        }
      }
      google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription>::
      operator++(&local_40);
    }
    pMVar4 = Specification::Model::description((Model *)inputs.super_RepeatedPtrFieldBase.rep_);
    pRVar5 = Specification::ModelDescription::output(pMVar4);
    google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::RepeatedPtrField
              ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)&__range1_1,pRVar5);
    __end1_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                         ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)&__range1_1
                         );
    output = (FeatureDescription *)
             google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                       ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)&__range1_1);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<CoreML::Specification::FeatureDescription>::operator!=
                             (&__end1_1,(iterator *)&output), bVar1) {
      pFVar6 = google::protobuf::internal::
               RepeatedPtrIterator<CoreML::Specification::FeatureDescription>::operator*(&__end1_1);
      pFVar7 = Specification::FeatureDescription::type(pFVar6);
      TVar2 = Specification::FeatureType::Type_case(pFVar7);
      if (TVar2 == kMultiArrayType) {
        pFVar7 = Specification::FeatureDescription::type(pFVar6);
        pAVar8 = Specification::FeatureType::multiarraytype(pFVar7);
        AVar3 = Specification::ArrayFeatureType::datatype(pAVar8);
        if (AVar3 == ArrayFeatureType_ArrayDataType_FLOAT32) {
          model_local._7_1_ = true;
          goto LAB_003563f0;
        }
      }
      google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription>::
      operator++(&__end1_1);
    }
    model_local._7_1_ = false;
LAB_003563f0:
    outputs.super_RepeatedPtrFieldBase.rep_._4_4_ = 1;
    google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::~RepeatedPtrField
              ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)&__range1_1);
LAB_003563f9:
    google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::~RepeatedPtrField
              ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)&__range1);
  }
  else {
    model_local._7_1_ = false;
  }
  return model_local._7_1_;
}

Assistant:

bool CoreML::hasFloat32InputsOrOutputsForNonmaxSuppression(const Specification::Model& model) {
    if (!hasNonmaxSuppression(model)) {
        // not NMS.
        return false;
    }

    auto inputs = model.description().input();
    for (const auto& input: inputs) {
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            if (input.type().multiarraytype().datatype() == Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                return true;
            }
        }
    }

    auto outputs = model.description().output();
    for (const auto& output: outputs) {
        if (output.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            if (output.type().multiarraytype().datatype() == Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                return true;
            }
        }
    }

    return false;
}